

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ikcp.c
# Opt level: O1

void ikcp_release(ikcpcb *kcp)

{
  IQUEUEHEAD *pIVar1;
  char *__ptr;
  IUINT32 *__ptr_00;
  IQUEUEHEAD *pIVar2;
  
  if (kcp == (ikcpcb *)0x0) {
    __assert_fail("kcp",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/3rd/kcp/ikcp.c"
                  ,0x12f,"void ikcp_release(ikcpcb *)");
  }
  pIVar2 = (kcp->snd_buf).next;
  while (&kcp->snd_buf != pIVar2) {
    pIVar1 = pIVar2->next;
    pIVar1->prev = pIVar2->prev;
    pIVar2->prev->next = pIVar1;
    pIVar2->next = (IQUEUEHEAD *)0x0;
    pIVar2->prev = (IQUEUEHEAD *)0x0;
    if (ikcp_free_hook == (_func_void_void_ptr *)0x0) {
      free(pIVar2);
    }
    else {
      (*ikcp_free_hook)(pIVar2);
    }
    pIVar2 = (kcp->snd_buf).next;
  }
  pIVar2 = (kcp->rcv_buf).next;
  while (&kcp->rcv_buf != pIVar2) {
    pIVar1 = pIVar2->next;
    pIVar1->prev = pIVar2->prev;
    pIVar2->prev->next = pIVar1;
    pIVar2->next = (IQUEUEHEAD *)0x0;
    pIVar2->prev = (IQUEUEHEAD *)0x0;
    if (ikcp_free_hook == (_func_void_void_ptr *)0x0) {
      free(pIVar2);
    }
    else {
      (*ikcp_free_hook)(pIVar2);
    }
    pIVar2 = (kcp->rcv_buf).next;
  }
  pIVar2 = (kcp->snd_queue).next;
  while (&kcp->snd_queue != pIVar2) {
    pIVar1 = pIVar2->next;
    pIVar1->prev = pIVar2->prev;
    pIVar2->prev->next = pIVar1;
    pIVar2->next = (IQUEUEHEAD *)0x0;
    pIVar2->prev = (IQUEUEHEAD *)0x0;
    if (ikcp_free_hook == (_func_void_void_ptr *)0x0) {
      free(pIVar2);
    }
    else {
      (*ikcp_free_hook)(pIVar2);
    }
    pIVar2 = (kcp->snd_queue).next;
  }
  pIVar2 = (kcp->rcv_queue).next;
  while (&kcp->rcv_queue != pIVar2) {
    pIVar1 = pIVar2->next;
    pIVar1->prev = pIVar2->prev;
    pIVar2->prev->next = pIVar1;
    pIVar2->next = (IQUEUEHEAD *)0x0;
    pIVar2->prev = (IQUEUEHEAD *)0x0;
    if (ikcp_free_hook == (_func_void_void_ptr *)0x0) {
      free(pIVar2);
    }
    else {
      (*ikcp_free_hook)(pIVar2);
    }
    pIVar2 = (kcp->rcv_queue).next;
  }
  __ptr = kcp->buffer;
  if (__ptr != (char *)0x0) {
    if (ikcp_free_hook == (_func_void_void_ptr *)0x0) {
      free(__ptr);
    }
    else {
      (*ikcp_free_hook)(__ptr);
    }
  }
  __ptr_00 = kcp->acklist;
  if (__ptr_00 != (IUINT32 *)0x0) {
    if (ikcp_free_hook == (_func_void_void_ptr *)0x0) {
      free(__ptr_00);
    }
    else {
      (*ikcp_free_hook)(__ptr_00);
    }
  }
  kcp->ackcount = 0;
  kcp->buffer = (char *)0x0;
  kcp->acklist = (IUINT32 *)0x0;
  kcp->nrcv_buf = 0;
  kcp->nsnd_buf = 0;
  kcp->nrcv_que = 0;
  kcp->nsnd_que = 0;
  if (ikcp_free_hook != (_func_void_void_ptr *)0x0) {
    (*ikcp_free_hook)(kcp);
    return;
  }
  free(kcp);
  return;
}

Assistant:

void ikcp_release(ikcpcb *kcp)
{
	assert(kcp);
	if (kcp) {
		IKCPSEG *seg;
		while (!iqueue_is_empty(&kcp->snd_buf)) {
			seg = iqueue_entry(kcp->snd_buf.next, IKCPSEG, node);
			iqueue_del(&seg->node);
			ikcp_segment_delete(kcp, seg);
		}
		while (!iqueue_is_empty(&kcp->rcv_buf)) {
			seg = iqueue_entry(kcp->rcv_buf.next, IKCPSEG, node);
			iqueue_del(&seg->node);
			ikcp_segment_delete(kcp, seg);
		}
		while (!iqueue_is_empty(&kcp->snd_queue)) {
			seg = iqueue_entry(kcp->snd_queue.next, IKCPSEG, node);
			iqueue_del(&seg->node);
			ikcp_segment_delete(kcp, seg);
		}
		while (!iqueue_is_empty(&kcp->rcv_queue)) {
			seg = iqueue_entry(kcp->rcv_queue.next, IKCPSEG, node);
			iqueue_del(&seg->node);
			ikcp_segment_delete(kcp, seg);
		}
		if (kcp->buffer) {
			ikcp_free(kcp->buffer);
		}
		if (kcp->acklist) {
			ikcp_free(kcp->acklist);
		}

		kcp->nrcv_buf = 0;
		kcp->nsnd_buf = 0;
		kcp->nrcv_que = 0;
		kcp->nsnd_que = 0;
		kcp->ackcount = 0;
		kcp->buffer = NULL;
		kcp->acklist = NULL;
		ikcp_free(kcp);
	}
}